

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlstring.c
# Opt level: O3

int xmlStrcmp(xmlChar *str1,xmlChar *str2)

{
  byte *pbVar1;
  int iVar2;
  long lVar3;
  
  if (str1 != str2) {
    if (str1 == (xmlChar *)0x0) {
      return -1;
    }
    if (str2 == (xmlChar *)0x0) {
      return 1;
    }
    lVar3 = 0;
    do {
      pbVar1 = str2 + lVar3;
      iVar2 = (uint)str1[lVar3] - (uint)*pbVar1;
      if (iVar2 != 0) {
        return iVar2;
      }
      lVar3 = lVar3 + 1;
    } while (*pbVar1 != 0);
  }
  return 0;
}

Assistant:

int
xmlStrcmp(const xmlChar *str1, const xmlChar *str2) {
    if (str1 == str2) return(0);
    if (str1 == NULL) return(-1);
    if (str2 == NULL) return(1);
#ifdef FUZZING_BUILD_MODE_UNSAFE_FOR_PRODUCTION
    return(strcmp((const char *)str1, (const char *)str2));
#else
    do {
        int tmp = *str1++ - *str2;
        if (tmp != 0) return(tmp);
    } while (*str2++ != 0);
    return 0;
#endif
}